

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
::~vector(vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
          *this)

{
  this->nStored = 0;
  pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>::
  deallocate_object<pbrt::RealisticCamera::LensElementInterface>
            (&this->alloc,this->ptr,this->nAlloc);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }